

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

int lua_getmetatable(lua_State *L,int objindex)

{
  code cVar1;
  ushort uVar2;
  Table *pTVar3;
  StkId pTVar4;
  int *piVar5;
  int iVar6;
  TValue *pTVar7;
  Table **ppTVar8;
  uint uVar9;
  ushort uVar10;
  char *pcVar11;
  
  iVar6 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar6 + 1;
  if (iVar6 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x3a0,"int lua_getmetatable(lua_State *, int)");
  }
  pTVar7 = index2addr(L,objindex);
  uVar2 = pTVar7->tt_;
  uVar10 = uVar2 & 0x7f;
  uVar9 = (uint)uVar2;
  if (uVar10 < 0x15) {
    if (uVar10 == 5) {
      if (uVar9 != 0x8005) {
        pcVar11 = "((((obj))->tt_) == (((5) | (1 << 15))))";
LAB_00112895:
        __assert_fail(pcVar11,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x3a8,"int lua_getmetatable(lua_State *, int)");
      }
      if ((pTVar7->value_).f[8] != (_func_int_lua_State_ptr)0x5) {
        pcVar11 = "(((obj)->value_).gc)->tt == 5";
        goto LAB_00112895;
      }
      ppTVar8 = (Table **)((pTVar7->value_).f + 0x28);
    }
    else {
      if (uVar10 != 7) goto LAB_00112722;
      if (uVar9 != 0x8007) {
        pcVar11 = "((((obj))->tt_) == (((7) | (1 << 15))))";
LAB_00112876:
        __assert_fail(pcVar11,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x3ab,"int lua_getmetatable(lua_State *, int)");
      }
      if ((pTVar7->value_).f[8] != (_func_int_lua_State_ptr)0x7) {
        pcVar11 = "(((obj)->value_).gc)->tt == 7";
        goto LAB_00112876;
      }
      ppTVar8 = (Table **)((pTVar7->value_).f + 0x10);
    }
  }
  else if ((uVar10 == 0x25) || (uVar10 == 0x15)) {
    if ((uVar2 != 0x8015) && (uVar9 != 0x8025)) {
      pcVar11 = 
      "(((((obj))->tt_) == (((((5) | ((1) << 4))) | (1 << 15)))) || ((((obj))->tt_) == (((((5) | ((2) << 4))) | (1 << 15)))))"
      ;
LAB_0011284e:
      __assert_fail(pcVar11,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x3a5,"int lua_getmetatable(lua_State *, int)");
    }
    cVar1 = (pTVar7->value_).f[8];
    if ((cVar1 != (code)0x15) && (cVar1 != (code)0x25)) {
      pcVar11 = 
      "((((obj)->value_).gc)->tt == ((5) | ((1) << 4)) || (((obj)->value_).gc)->tt == ((5) | ((2) << 4)))"
      ;
      goto LAB_0011284e;
    }
    ppTVar8 = (Table **)((pTVar7->value_).f + 0x38);
  }
  else {
LAB_00112722:
    ppTVar8 = L->l_G->mt + (uVar9 & 0xf);
  }
  pTVar3 = *ppTVar8;
  if (pTVar3 != (Table *)0x0) {
    if ((pTVar3->tt & 0xe) < 10) {
      pTVar4 = L->top;
      (pTVar4->value_).gc = (GCObject *)pTVar3;
      pTVar4->tt_ = 0x8005;
      if ((pTVar3->tt == '\x05') && ((pTVar3->marked & (L->l_G->currentwhite ^ 0x18)) == 0)) {
        pTVar4 = L->top;
        iVar6 = 1;
        L->top = pTVar4 + 1;
        if (L->ci->top < pTVar4 + 1) {
          __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0x3b3,"int lua_getmetatable(lua_State *, int)");
        }
        goto LAB_001127c5;
      }
      pcVar11 = "0";
    }
    else {
      pcVar11 = "(((x_)->tt) & 0x0F) < (9+1)";
    }
    __assert_fail(pcVar11,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x3b2,"int lua_getmetatable(lua_State *, int)");
  }
  iVar6 = 0;
LAB_001127c5:
  piVar5 = *(int **)&L[-1].hookmask;
  *piVar5 = *piVar5 + -1;
  if (*piVar5 == 0) {
    return iVar6;
  }
  __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x3b6,"int lua_getmetatable(lua_State *, int)");
}

Assistant:

LUA_API int lua_getmetatable (lua_State *L, int objindex) {
  const TValue *obj;
  Table *mt;
  int res = 0;
  lua_lock(L);
  obj = index2addr(L, objindex);
  switch (ttype(obj)) {
    case RAVI_TIARRAY:
    case RAVI_TFARRAY:
      mt = arrvalue(obj)->metatable;
      break;
    case LUA_TTABLE:
      mt = hvalue(obj)->metatable;
      break;
    case LUA_TUSERDATA:
      mt = uvalue(obj)->metatable;
      break;
    default:
      mt = G(L)->mt[ttnov(obj)];
      break;
  }
  if (mt != NULL) {
    sethvalue(L, L->top, mt);
    api_incr_top(L);
    res = 1;
  }
  lua_unlock(L);
  return res;
}